

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection-visitor.hpp
# Opt level: O2

void miyuki::refl::
     accept<miyuki::serialize::AutoLoadVisitor,std::shared_ptr<Bar>,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
               (AutoLoadVisitor visitor,char **args_s,shared_ptr<Bar> *t,shared_ptr<Bar> *args,
               vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *args_1)

{
  serialize::InputArchive::_load_nvp<std::shared_ptr<Bar>>(visitor.ar,*args_s,t);
  accept<miyuki::serialize::AutoLoadVisitor,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
            (visitor,args_s + 1,args,args_1);
  return;
}

Assistant:

void accept(Visitor visitor, const char **args_s, T &t, Args &... args) {
        visitor.visit(t, *args_s);
        accept<Visitor, Args...>(visitor, args_s + 1, args...);
    }